

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb__sort_chunks(stb__alloc *src)

{
  stb__chunk *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  psVar1 = src->chunks;
  puVar2 = *(undefined8 **)((long)&psVar1[-1].alloc + 2);
  if ((puVar2 != (undefined8 *)0x0) && (*(int *)((long)&psVar1->next + 6) <= *(int *)(puVar2 + 1)))
  {
    puVar3 = (undefined8 *)((long)&psVar1[-1].alloc + 2);
    *puVar3 = *puVar2;
    *puVar2 = puVar3;
    src->chunks = (stb__chunk *)((long)puVar2 + 2);
  }
  return;
}

Assistant:

static void stb__sort_chunks(stb__alloc *src)
{
   // of the first two chunks, put the chunk with more data left in it first
   stb__chunk *c = stb__chunks(src), *d;
   if (c == NULL) return;
   d = c->next;
   if (d == NULL) return;
   if (c->data_left > d->data_left) return;

   c->next = d->next;
   d->next = c;
   stb__setchunks(src, d);
}